

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

int32 dumb_resample_n_2_2(int n,DUMB_RESAMPLER *resampler,sample_t_conflict *dst,int32 dst_size,
                         DUMB_VOLUME_RAMP_INFO *volume_left,DUMB_VOLUME_RAMP_INFO *volume_right,
                         double delta)

{
  int in_EDI;
  double in_stack_000000e0;
  DUMB_VOLUME_RAMP_INFO *in_stack_000000e8;
  DUMB_VOLUME_RAMP_INFO *in_stack_000000f0;
  int32 in_stack_000000fc;
  sample_t_conflict *in_stack_00000100;
  DUMB_RESAMPLER *in_stack_00000108;
  double in_stack_00000110;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000118;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000120;
  int32 in_stack_0000012c;
  sample_t_conflict *in_stack_00000130;
  DUMB_RESAMPLER *in_stack_00000138;
  double in_stack_00000180;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000188;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000190;
  int32 in_stack_0000019c;
  sample_t_conflict *in_stack_000001a0;
  DUMB_RESAMPLER *in_stack_000001a8;
  undefined4 local_4;
  
  if (in_EDI == 8) {
    local_4 = dumb_resample_8_2_2(in_stack_00000108,in_stack_00000100,in_stack_000000fc,
                                  in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  }
  else if (in_EDI == 0x10) {
    local_4 = dumb_resample_16_2_2
                        (in_stack_00000138,in_stack_00000130,in_stack_0000012c,in_stack_00000120,
                         in_stack_00000118,in_stack_00000110);
  }
  else {
    local_4 = dumb_resample_2_2(in_stack_000001a8,in_stack_000001a0,in_stack_0000019c,
                                in_stack_00000190,in_stack_00000188,in_stack_00000180);
  }
  return local_4;
}

Assistant:

int32 dumb_resample_n_2_2(int n, DUMB_RESAMPLER *resampler, sample_t *dst, int32 dst_size, DUMB_VOLUME_RAMP_INFO * volume_left, DUMB_VOLUME_RAMP_INFO * volume_right, double delta)
{
	if (n == 8)
		return dumb_resample_8_2_2(resampler, dst, dst_size, volume_left, volume_right, delta);
	else if (n == 16)
		return dumb_resample_16_2_2(resampler, dst, dst_size, volume_left, volume_right, delta);
	else
		return dumb_resample_2_2(resampler, dst, dst_size, volume_left, volume_right, delta);
}